

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O2

int dsdKernelFindCommonComponents
              (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pL,Dsd_Node_t *pH,Dsd_Node_t ***pCommon,
              Dsd_Node_t **pLastDiffL,Dsd_Node_t **pLastDiffH)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  Dsd_Node_t *pDVar5;
  Dsd_Node_t *pDVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int local_44;
  
  sVar1 = pL->nDecs;
  sVar2 = pH->nDecs;
  local_44 = 0;
  iVar11 = 0;
  uVar10 = 0;
LAB_00641e2d:
  uVar10 = (ulong)(int)uVar10;
  do {
    iVar9 = (int)uVar10;
    if (sVar1 <= iVar11) {
LAB_00641ee8:
      if (iVar9 < sVar2) {
        *pLastDiffH = pH->pDecs[uVar10];
      }
      *pCommon = dsdKernelFindCommonComponents::Common;
      return local_44;
    }
    pDVar5 = pL->pDecs[iVar11];
    if (sVar2 <= iVar9) {
      *pLastDiffL = pDVar5;
      goto LAB_00641ee8;
    }
    pDVar6 = pH->pDecs[uVar10];
    piVar7 = pDsdMan->dd->perm;
    uVar3 = **(uint **)(((ulong)pDVar5 & 0xfffffffffffffffe) + 0x10);
    uVar4 = **(uint **)(((ulong)pDVar6 & 0xfffffffffffffffe) + 0x10);
    if ((piVar7[uVar3] < piVar7[uVar4]) || (uVar4 == uVar3)) break;
    *pLastDiffH = pDVar6;
    uVar10 = uVar10 + 1;
  } while( true );
  if (uVar3 == uVar4) {
    if (pDVar5 == pDVar6) {
      lVar8 = (long)local_44;
      local_44 = local_44 + 1;
      dsdKernelFindCommonComponents::Common[lVar8] = pDVar5;
    }
    else {
      *pLastDiffL = pDVar5;
      *pLastDiffH = pH->pDecs[uVar10];
    }
    iVar11 = iVar11 + 1;
    uVar10 = (ulong)(iVar9 + 1);
  }
  else {
    iVar11 = iVar11 + 1;
    *pLastDiffL = pDVar5;
  }
  goto LAB_00641e2d;
}

Assistant:

int dsdKernelFindCommonComponents( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pL, Dsd_Node_t * pH, Dsd_Node_t *** pCommon, Dsd_Node_t ** pLastDiffL, Dsd_Node_t ** pLastDiffH )
{
    static Dsd_Node_t * Common[MAXINPUTS];
    int nCommon = 0;

    // pointers to the current decomposition entries
    Dsd_Node_t * pLcur;
    Dsd_Node_t * pHcur;

    // the pointers to their supports
    DdNode * bSLcur;
    DdNode * bSHcur;

    // the top variable in the supports
    int TopVar;

    // the indices running through the components
    int iCurL = 0;
    int iCurH = 0;
    while ( iCurL < pL->nDecs && iCurH < pH->nDecs )
    { // both did not run out

        pLcur = Dsd_Regular(pL->pDecs[iCurL]);
        pHcur = Dsd_Regular(pH->pDecs[iCurH]);

        bSLcur = pLcur->S;
        bSHcur = pHcur->S;

        // find out what component is higher in the BDD
        if ( pDsdMan->dd->perm[bSLcur->index] < pDsdMan->dd->perm[bSHcur->index] )
            TopVar = bSLcur->index;
        else
            TopVar = bSHcur->index;

        if ( TopVar == bSLcur->index && TopVar == bSHcur->index ) 
        {
            // the components may be equal - should match exactly!
            if ( pL->pDecs[iCurL] == pH->pDecs[iCurH] )
                Common[nCommon++] = pL->pDecs[iCurL];
            else
            {
                *pLastDiffL = pL->pDecs[iCurL];
                *pLastDiffH = pH->pDecs[iCurH];
            }

            // skip both
            iCurL++;
            iCurH++;
        }
        else if ( TopVar == bSLcur->index )
        {  // the components cannot be equal
            // skip the top-most one
            *pLastDiffL = pL->pDecs[iCurL++];
        }
        else // if ( TopVar == bSHcur->index )
        {  // the components cannot be equal
            // skip the top-most one
            *pLastDiffH = pH->pDecs[iCurH++];
        }
    }

    // if one of the lists still has components, write the first one down
    if ( iCurL < pL->nDecs )
        *pLastDiffL = pL->pDecs[iCurL];

    if ( iCurH < pH->nDecs )
        *pLastDiffH = pH->pDecs[iCurH];

    // return the pointer to the array
    *pCommon = Common;
    // return the number of common components
    return nCommon;         
}